

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

char * json_serialize_to_string(JSON_Value *value)

{
  JSON_Status JVar1;
  size_t sVar2;
  char *in_RDI;
  char *buf;
  size_t buf_size_bytes;
  JSON_Status serialization_result;
  JSON_Value *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar3;
  JSON_Value *in_stack_fffffffffffffff8;
  char *pcVar4;
  
  uVar3 = 0xffffffff;
  sVar2 = json_serialization_size(in_stack_00000020);
  if (sVar2 == 0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar4 = (char *)(*parson_malloc)(sVar2);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      JVar1 = json_serialize_to_buffer
                        (in_stack_fffffffffffffff8,in_RDI,CONCAT44(uVar3,in_stack_ffffffffffffffe8))
      ;
      if (JVar1 != 0) {
        json_free_serialized_string((char *)0x285bb6);
        pcVar4 = (char *)0x0;
      }
    }
  }
  return pcVar4;
}

Assistant:

char * json_serialize_to_string(const JSON_Value *value) {
    JSON_Status serialization_result = JSONFailure;
    size_t buf_size_bytes = json_serialization_size(value);
    char *buf = NULL;
    if (buf_size_bytes == 0) {
        return NULL;
    }
    buf = (char*)parson_malloc(buf_size_bytes);
    if (buf == NULL) {
        return NULL;
    }
    serialization_result = json_serialize_to_buffer(value, buf, buf_size_bytes);
    if (serialization_result != JSONSuccess) {
        json_free_serialized_string(buf);
        return NULL;
    }
    return buf;
}